

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O1

void test_broadcast(void)

{
  socklen_t __len;
  sockaddr *__addr;
  int in_ESI;
  int iVar1;
  long **pplVar2;
  thread t2;
  thread t1;
  UDPsocket cs;
  UDPsocket ss;
  long *local_80;
  long local_78;
  long local_70;
  UDPsocket local_68;
  UDPsocket local_3c;
  
  local_3c.sock = -1;
  local_3c.self_addr_len = 0x10;
  local_3c.peer_addr_len = 0x10;
  local_3c.self_addr.sin_family = 2;
  local_3c.self_addr.sin_port = 0;
  local_3c.self_addr.sin_addr.s_addr = 0;
  __len = 0;
  local_3c.self_addr.sin_zero[0] = '\0';
  local_3c.self_addr.sin_zero[1] = '\0';
  local_3c.self_addr.sin_zero[2] = '\0';
  local_3c.self_addr.sin_zero[3] = '\0';
  local_3c.self_addr.sin_zero[4] = '\0';
  local_3c.self_addr.sin_zero[5] = '\0';
  local_3c.self_addr.sin_zero[6] = '\0';
  local_3c.self_addr.sin_zero[7] = '\0';
  local_3c.peer_addr.sin_family = 2;
  local_3c.peer_addr.sin_port = 0;
  local_3c.peer_addr.sin_addr.s_addr = 0;
  local_3c.peer_addr.sin_zero[0] = '\0';
  local_3c.peer_addr.sin_zero[1] = '\0';
  local_3c.peer_addr.sin_zero[2] = '\0';
  local_3c.peer_addr.sin_zero[3] = '\0';
  local_3c.peer_addr.sin_zero[4] = '\0';
  local_3c.peer_addr.sin_zero[5] = '\0';
  local_3c.peer_addr.sin_zero[6] = '\0';
  local_3c.peer_addr.sin_zero[7] = '\0';
  UDPsocket::close(&local_3c,in_ESI);
  local_3c.sock = socket(2,2,0x11);
  local_68.self_addr.sin_family = 0x7e4;
  local_68.sock = 0;
  iVar1 = (int)&local_68;
  UDPsocket::bind(&local_3c,iVar1,__addr,__len);
  local_68.sock = -1;
  local_68.self_addr_len = 0x10;
  local_68.peer_addr_len = 0x10;
  local_68.self_addr.sin_family = 2;
  local_68.self_addr.sin_port = 0;
  local_68.self_addr.sin_addr.s_addr = 0;
  local_68.self_addr.sin_zero[0] = '\0';
  local_68.self_addr.sin_zero[1] = '\0';
  local_68.self_addr.sin_zero[2] = '\0';
  local_68.self_addr.sin_zero[3] = '\0';
  local_68.self_addr.sin_zero[4] = '\0';
  local_68.self_addr.sin_zero[5] = '\0';
  local_68.self_addr.sin_zero[6] = '\0';
  local_68.self_addr.sin_zero[7] = '\0';
  local_68.peer_addr.sin_family = 2;
  local_68.peer_addr.sin_port = 0;
  local_68.peer_addr.sin_addr.s_addr = 0;
  local_68.peer_addr.sin_zero[0] = '\0';
  local_68.peer_addr.sin_zero[1] = '\0';
  local_68.peer_addr.sin_zero[2] = '\0';
  local_68.peer_addr.sin_zero[3] = '\0';
  local_68.peer_addr.sin_zero[4] = '\0';
  local_68.peer_addr.sin_zero[5] = '\0';
  local_68.peer_addr.sin_zero[6] = '\0';
  local_68.peer_addr.sin_zero[7] = '\0';
  UDPsocket::close(&local_68,iVar1);
  local_68.sock = socket(2,2,0x11);
  local_80 = (long *)CONCAT44(local_80._4_4_,1);
  setsockopt(local_68.sock,1,6,&local_80,4);
  local_70 = 0;
  local_80 = (long *)operator_new(0x18);
  *local_80 = (long)&PTR___State_00105d50;
  local_80[1] = (long)&local_3c;
  local_80[2] = (long)&local_68;
  std::thread::_M_start_thread(&local_70,&local_80,0);
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 8))();
  }
  local_78 = 0;
  local_80 = (long *)operator_new(0x10);
  *local_80 = (long)&PTR___State_00105d90;
  local_80[1] = (long)&local_68;
  pplVar2 = &local_80;
  std::thread::_M_start_thread(&local_78,pplVar2,0);
  iVar1 = (int)pplVar2;
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 8))();
  }
  std::thread::join();
  std::thread::join();
  if ((local_78 == 0) && (local_70 == 0)) {
    UDPsocket::close(&local_68,iVar1);
    UDPsocket::close(&local_3c,iVar1);
    return;
  }
  std::terminate();
}

Assistant:

void test_broadcast()
{
	UDPsocket ss;
	ss.open();
	ss.bind(PortNo);

	UDPsocket cs;
	cs.open();
	cs.broadcast(true);

	auto t1 = std::thread([&ss, &cs]
	{
		std::this_thread::sleep_for(IterDuration * 1.25);
		for (uint16_t i = 0; i < 2 * IterCount; ++i)
		{
			UDPsocket::IPv4 ipaddr;
			std::string data;
			if (ss.recv(data, ipaddr) < 0)
			{
				fprintf(stderr, "recv(): failed\n");
			}
			else
			{
				if (!data.empty())
				{
					fprintf(stderr, "%s  '%s'\n", ipaddr.to_string().c_str(), data.c_str());
					if (data.compare(0, 8, "MESSAGE?"s) == 0)
					{
						ipaddr.port = PortNo;
						if ((i & 0x2 ? cs : ss).send("MESSAGE!"s, ipaddr) < 0)
						{
							fprintf(stderr, "send(): failed (REP)\n");
						}
					}
				}
			}
		}
		ss.close();
	});

	auto t2 = std::thread([&cs]
	{
		for (uint8_t i = 0; i < IterCount; ++i)
		{
			if (cs.send("MESSAGE?"s, UDPsocket::IPv4::Broadcast(PortNo)) < 0)
			{
				fprintf(stderr, "send(): failed (REQ)\n");
			}
			std::this_thread::sleep_for(IterDuration);
		}
		cs.close();
	});

	t1.join();
	t2.join();
}